

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOffsetGroup::init
          (SingleVertexArrayOffsetGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  int t;
  InputType type;
  GLValue max_;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_00;
  int iVar6;
  long *plVar7;
  ulong *puVar8;
  int **ppiVar9;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  undefined8 uVar13;
  InputType IVar14;
  GLValue GVar15;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_198 [16];
  pointer local_188;
  pointer pAStack_180;
  pointer local_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long local_150;
  SingleVertexArrayOffsetGroup *local_148;
  uint local_13c;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  long local_118;
  string local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 local_b0 [16];
  int *local_a0;
  long lStack_98;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_150 = 0;
  local_148 = this;
  do {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_118 = 0;
    do {
      local_13c = (uint)in_RAX;
      lVar10 = 0;
      do {
        IVar14 = this->m_type & ~INPUTTYPE_FIXED;
        if (lVar10 == 0) {
          iVar2 = deqp::gls::Array::inputTypeSize(this->m_type);
          iVar2 = iVar2 << (IVar14 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) + 1;
        }
        else {
          iVar2 = *(int *)((long)&DAT_01bfd070 + lVar10);
        }
        iVar3 = deqp::gls::Array::inputTypeSize(this->m_type);
        iVar6 = iVar3 * 4;
        if (IVar14 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar6 = iVar3;
        }
        iVar3 = *(int *)(&DAT_01bcbe30 + local_150 * 4);
        typeToString<int>(&local_70,iVar3);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1c5456a);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_c0 = *plVar7;
          lStack_b8 = plVar4[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar7;
          local_d0 = (long *)*plVar4;
        }
        local_c8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        puVar8 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar8) {
          local_128 = *puVar8;
          lStack_120 = plVar4[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *puVar8;
          local_138 = (ulong *)*plVar4;
        }
        local_130 = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        typeToString<int>(&local_f0,iVar2);
        uVar11 = 0xf;
        if (local_138 != &local_128) {
          uVar11 = local_128;
        }
        if (uVar11 < local_f0._M_string_length + local_130) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            uVar13 = local_f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_f0._M_string_length + local_130) goto LAB_0117594d;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_138);
        }
        else {
LAB_0117594d:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_138,(ulong)local_f0._M_dataplus._M_p);
        }
        local_198._0_8_ = &local_188;
        ppAVar1 = (pointer *)(puVar5 + 2);
        if ((pointer *)*puVar5 == ppAVar1) {
          local_188 = *ppAVar1;
          pAStack_180 = (pointer)puVar5[3];
        }
        else {
          local_188 = *ppAVar1;
          local_198._0_8_ = (pointer *)*puVar5;
        }
        local_198._8_8_ = puVar5[1];
        *puVar5 = ppAVar1;
        puVar5[1] = 0;
        *(undefined1 *)ppAVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append(local_198);
        local_b0._0_8_ = &local_a0;
        ppiVar9 = (int **)(plVar4 + 2);
        if ((int **)*plVar4 == ppiVar9) {
          local_a0 = *ppiVar9;
          lStack_98 = plVar4[3];
        }
        else {
          local_a0 = *ppiVar9;
          local_b0._0_8_ = (int **)*plVar4;
        }
        local_b0._8_8_ = plVar4[1];
        *plVar4 = (long)ppiVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        t = (&DAT_01bcc010)[local_118];
        typeToString<int>(&local_110,t);
        piVar12 = (int *)0xf;
        if ((int **)local_b0._0_8_ != &local_a0) {
          piVar12 = local_a0;
        }
        if (piVar12 < (int *)(local_110._M_string_length + local_b0._8_8_)) {
          uVar13 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            uVar13 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < (int *)(local_110._M_string_length + local_b0._8_8_))
          goto LAB_01175aa0;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_b0._0_8_);
        }
        else {
LAB_01175aa0:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_b0,(ulong)local_110._M_dataplus._M_p);
        }
        local_170 = &local_160;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_160 = *plVar4;
          uStack_158 = puVar5[3];
        }
        else {
          local_160 = *plVar4;
          local_170 = (long *)*puVar5;
        }
        local_168 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_b0._0_8_ != &local_a0) {
          operator_delete((void *)local_b0._0_8_,(long)local_a0 + 1);
        }
        if ((pointer *)local_198._0_8_ != &local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)((long)&local_188->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,local_128 + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        type = local_148->m_type;
        GVar15 = deqp::gls::GLValue::getMinValue(type);
        aStack_38 = GVar15.field_1;
        local_40 = GVar15.type;
        GVar15 = deqp::gls::GLValue::getMaxValue(local_148->m_type);
        aStack_48 = GVar15.field_1;
        local_50 = GVar15.type;
        max_._4_4_ = uStack_4c;
        max_.type = local_50;
        GVar15._4_4_ = uStack_3c;
        GVar15.type = local_40;
        GVar15.field_1 = aStack_38;
        max_.field_1 = aStack_48;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_b0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                   (uint)(IVar14 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,iVar3,iVar2,false,
                   GVar15,max_);
        local_188 = (pointer)0x0;
        pAStack_180 = (pointer)0x0;
        local_178 = (pointer)0x0;
        local_198._4_4_ = t;
        local_198._0_4_ = PRIMITIVE_TRIANGLES;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_188,(iterator)0x0,(ArraySpec *)local_b0);
        this = local_148;
        if (iVar2 % iVar6 == 0 && iVar3 % iVar6 == 0) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_198,(char *)local_170,(char *)local_170);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        if (local_188 != (pointer)0x0) {
          operator_delete(local_188,(long)local_178 - (long)local_188);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      local_118 = 1;
      in_RAX = 0;
    } while ((local_13c & 1) != 0);
    local_150 = local_150 + 1;
    if (local_150 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayOffsetGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const bool			packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
				const int			componentCount	= (packed) ? (4) : (2);
				const int			stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(m_type) * componentCount : strides[strideNdx]);
				const int			alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
				const bool			aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
				const std::string	name			= "offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																Array::USAGE_DYNAMIC_DRAW,
																componentCount,
																offsets[offsetNdx],
																stride,
																false,
																GLValue::getMinValue(m_type),
																GLValue::getMaxValue(m_type));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}